

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadGeometryVertexBuffer
          (OgreXmlSerializer *this,VertexDataXml *dest)

{
  string *psVar1;
  pointer *ppaVar2;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *pvVar3;
  pointer pvVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Logger *pLVar11;
  undefined7 uVar13;
  runtime_error *prVar12;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  iterator iVar17;
  ulong uVar18;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *pvVar19;
  long lVar20;
  float fVar21;
  uint local_1fc;
  char *local_1e8 [2];
  char local_1d8 [16];
  uint local_1c8;
  uint local_1c4;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *local_1c0;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *local_1b8;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *local_1b0;
  undefined1 local_1a8 [8];
  float local_1a0;
  undefined1 local_198 [96];
  ios_base local_138 [264];
  
  iVar10 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"positions");
  if (CONCAT44(extraout_var,iVar10) == 0) {
    bVar6 = false;
  }
  else {
    bVar6 = ReadAttribute<bool>(this,"positions");
  }
  iVar10 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"normals");
  if (CONCAT44(extraout_var_00,iVar10) == 0) {
    bVar7 = false;
  }
  else {
    bVar7 = ReadAttribute<bool>(this,"normals");
  }
  iVar10 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"tangents");
  local_1fc = 0;
  if (CONCAT44(extraout_var_01,iVar10) == 0) {
    bVar8 = false;
  }
  else {
    bVar8 = ReadAttribute<bool>(this,"tangents");
  }
  iVar10 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"texture_coords");
  if (CONCAT44(extraout_var_02,iVar10) != 0) {
    local_1fc = ReadAttribute<unsigned_int>(this,"texture_coords");
  }
  if (bVar6 == false) {
    bVar9 = VertexDataXml::HasPositions(dest);
    if (!bVar9) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Vertex buffer does not contain positions!","");
      std::runtime_error::runtime_error(prVar12,(string *)local_1a8);
      *(undefined ***)prVar12 = &PTR__runtime_error_008dc448;
      __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pLVar11 = DefaultLogger::get();
    Logger::debug(pLVar11,"    - Contains positions");
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&dest->positions,(ulong)(dest->super_IVertexData).count);
  }
  if (bVar7 != false) {
    pLVar11 = DefaultLogger::get();
    Logger::debug(pLVar11,"    - Contains normals");
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&dest->normals,(ulong)(dest->super_IVertexData).count);
  }
  if (bVar8 != false) {
    pLVar11 = DefaultLogger::get();
    Logger::debug(pLVar11,"    - Contains tangents");
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&dest->tangents,(ulong)(dest->super_IVertexData).count);
  }
  if (local_1fc != 0) {
    pLVar11 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[16]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [16])"    - Contains ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," texture coords",0xf);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar11,local_1e8[0]);
    if (local_1e8[0] != local_1d8) {
      operator_delete(local_1e8[0]);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::
    vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
    ::resize(&dest->uvs,(ulong)local_1fc);
    lVar15 = (long)(dest->uvs).
                   super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(dest->uvs).
                   super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar15 != 0) {
      lVar15 = (lVar15 >> 3) * -0x5555555555555555;
      lVar15 = lVar15 + (ulong)(lVar15 == 0);
      lVar20 = 0;
      do {
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   ((long)&(((dest->uvs).
                             super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + lVar20),
                   (ulong)(dest->super_IVertexData).count);
        lVar20 = lVar20 + 0x18;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
  }
  NextNode_abi_cxx11_(this);
  psVar1 = &this->m_currentNodeName;
  local_1c0 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&dest->tangents;
  local_1b8 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&dest->normals;
  local_1b0 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&dest->positions;
  uVar13 = (undefined7)((ulong)local_1b0 >> 8);
  local_1c4 = (uint)CONCAT71(uVar13,1);
  local_1c8 = (uint)CONCAT71(uVar13,1);
  bVar9 = true;
  do {
    while( true ) {
      iVar10 = std::__cxx11::string::compare((char *)psVar1);
      if (((((iVar10 != 0) && (iVar10 = std::__cxx11::string::compare((char *)psVar1), iVar10 != 0))
           && (iVar10 = std::__cxx11::string::compare((char *)psVar1), iVar10 != 0)) &&
          ((iVar10 = std::__cxx11::string::compare((char *)psVar1), iVar10 != 0 &&
           (iVar10 = std::__cxx11::string::compare((char *)psVar1), iVar10 != 0)))) &&
         ((iVar10 = std::__cxx11::string::compare((char *)psVar1), iVar10 != 0 &&
          ((iVar10 = std::__cxx11::string::compare((char *)psVar1), iVar10 != 0 &&
           (iVar10 = std::__cxx11::string::compare((char *)psVar1), iVar10 != 0)))))) {
        lVar15 = (long)(dest->positions).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(dest->positions).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        if ((lVar15 >> 2) * -0x5555555555555555 - (ulong)(dest->super_IVertexData).count != 0) {
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Read only ",10);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," positions when should have read ",0x21);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar12,(string *)local_1e8);
          *(undefined ***)prVar12 = &PTR__runtime_error_008dc448;
          __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((bVar7 != false) &&
           ((long)(dest->normals).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(dest->normals).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start != lVar15)) {
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Read only ",10);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," normals when should have read ",0x1f);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar12,(string *)local_1e8);
          *(undefined ***)prVar12 = &PTR__runtime_error_008dc448;
          __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((bVar8 != false) &&
           ((long)(dest->tangents).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(dest->tangents).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start != lVar15)) {
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Read only ",10);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," tangents when should have read ",0x20);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar12,(string *)local_1e8);
          *(undefined ***)prVar12 = &PTR__runtime_error_008dc448;
          __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        pvVar4 = (dest->uvs).
                 super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar20 = (long)(dest->uvs).
                       super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4;
        if (lVar20 != 0) {
          uVar14 = (lVar20 >> 3) * -0x5555555555555555;
          uVar16 = 0;
          uVar18 = 1;
          do {
            if ((long)pvVar4[uVar16].
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                *(long *)&pvVar4[uVar16].
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data != lVar15) {
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Read only ",10);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," uvs for uv index ",0x12);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," when should have read ",0x17);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar12,(string *)local_1e8);
              *(undefined ***)prVar12 = &PTR__runtime_error_008dc448;
              __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            bVar6 = uVar18 <= uVar14;
            lVar20 = uVar14 - uVar18;
            uVar16 = uVar18;
            uVar18 = (ulong)((int)uVar18 + 1);
          } while (bVar6 && lVar20 != 0);
        }
        return;
      }
      iVar10 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar10 == 0) {
        NextNode_abi_cxx11_(this);
      }
      if ((bVar6 == false) || (iVar10 = std::__cxx11::string::compare((char *)psVar1), iVar10 != 0))
      break;
      local_1a8 = (undefined1  [8])0x0;
      local_1a0 = 0.0;
      fVar21 = ReadAttribute<float>(this,"x");
      local_1a8._0_4_ = fVar21;
      fVar21 = ReadAttribute<float>(this,"y");
      local_1a8._4_4_ = fVar21;
      local_1a0 = ReadAttribute<float>(this,"z");
      iVar17._M_current =
           (dest->positions).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pvVar19 = local_1b0;
      if (iVar17._M_current ==
          (dest->positions).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
LAB_004600f6:
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>(pvVar19,iVar17,(aiVector3t<float> *)local_1a8);
      }
      else {
        (iVar17._M_current)->z = local_1a0;
        (iVar17._M_current)->x = (float)local_1a8._0_4_;
        (iVar17._M_current)->y = (float)local_1a8._4_4_;
        ppaVar2 = &(dest->positions).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar2 = *ppaVar2 + 1;
      }
LAB_00460100:
      NextNode_abi_cxx11_(this);
    }
    if ((bVar7 != false) && (iVar10 = std::__cxx11::string::compare((char *)psVar1), iVar10 == 0)) {
      local_1a8 = (undefined1  [8])0x0;
      local_1a0 = 0.0;
      fVar21 = ReadAttribute<float>(this,"x");
      local_1a8._0_4_ = fVar21;
      fVar21 = ReadAttribute<float>(this,"y");
      local_1a8._4_4_ = fVar21;
      local_1a0 = ReadAttribute<float>(this,"z");
      iVar17._M_current =
           (dest->normals).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pvVar19 = local_1b8;
      if (iVar17._M_current ==
          (dest->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_004600f6;
      (iVar17._M_current)->z = local_1a0;
      (iVar17._M_current)->x = (float)local_1a8._0_4_;
      (iVar17._M_current)->y = (float)local_1a8._4_4_;
      ppaVar2 = &(dest->normals).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar2 = *ppaVar2 + 1;
      goto LAB_00460100;
    }
    if ((bVar8 != false) && (iVar10 = std::__cxx11::string::compare((char *)psVar1), iVar10 == 0)) {
      local_1a8 = (undefined1  [8])0x0;
      local_1a0 = 0.0;
      fVar21 = ReadAttribute<float>(this,"x");
      local_1a8._0_4_ = fVar21;
      fVar21 = ReadAttribute<float>(this,"y");
      local_1a8._4_4_ = fVar21;
      local_1a0 = ReadAttribute<float>(this,"z");
      iVar17._M_current =
           (dest->tangents).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pvVar19 = local_1c0;
      if (iVar17._M_current ==
          (dest->tangents).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) goto LAB_004600f6;
      (iVar17._M_current)->z = local_1a0;
      (iVar17._M_current)->x = (float)local_1a8._0_4_;
      (iVar17._M_current)->y = (float)local_1a8._4_4_;
      ppaVar2 = &(dest->tangents).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar2 = *ppaVar2 + 1;
      goto LAB_00460100;
    }
    if ((local_1fc == 0) || (iVar10 = std::__cxx11::string::compare((char *)psVar1), iVar10 != 0)) {
      iVar10 = std::__cxx11::string::compare((char *)psVar1);
      uVar5 = local_1c4;
      if (iVar10 == 0) {
        local_1c4 = 0;
joined_r0x0045feb3:
        if ((uVar5 & 1) == 0) goto LAB_00460100;
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)psVar1);
        uVar5 = local_1c8;
        if (iVar10 == 0) {
          local_1c8 = 0;
          goto joined_r0x0045feb3;
        }
        iVar10 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar10 == 0 && !bVar9) {
          bVar9 = false;
          goto LAB_00460100;
        }
        bVar9 = (bool)(bVar9 & iVar10 != 0);
      }
      pLVar11 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[59]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [59])"Vertex buffer attribute read not implemented for element: ");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(this->m_currentNodeName)._M_dataplus._M_p,
                 (this->m_currentNodeName)._M_string_length);
      std::__cxx11::stringbuf::str();
      Logger::warn(pLVar11,local_1e8[0]);
      if (local_1e8[0] != local_1d8) {
        operator_delete(local_1e8[0]);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      goto LAB_00460100;
    }
    pvVar3 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
             (dest->uvs).
             super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar19 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                   (dest->uvs).
                   super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pvVar19 != pvVar3;
        pvVar19 = pvVar19 + 0x18) {
      iVar10 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar10 != 0) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1a8 = (undefined1  [8])local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,
                   "Vertex buffer declared more UVs than can be found in a vertex","");
        std::runtime_error::runtime_error(prVar12,(string *)local_1a8);
        *(undefined ***)prVar12 = &PTR__runtime_error_008dc448;
        __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      local_1a8 = (undefined1  [8])0x0;
      local_1a0 = 0.0;
      fVar21 = ReadAttribute<float>(this,"u");
      local_1a8._0_4_ = fVar21;
      fVar21 = ReadAttribute<float>(this,"v");
      local_1a8._4_4_ = 1.0 - fVar21;
      iVar17._M_current = *(aiVector3t<float> **)(pvVar19 + 8);
      if (iVar17._M_current == *(aiVector3t<float> **)(pvVar19 + 0x10)) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>(pvVar19,iVar17,(aiVector3t<float> *)local_1a8);
      }
      else {
        (iVar17._M_current)->z = local_1a0;
        (iVar17._M_current)->x = (float)local_1a8._0_4_;
        (iVar17._M_current)->y = 1.0 - fVar21;
        *(long *)(pvVar19 + 8) = *(long *)(pvVar19 + 8) + 0xc;
      }
      NextNode_abi_cxx11_(this);
    }
  } while( true );
}

Assistant:

void OgreXmlSerializer::ReadGeometryVertexBuffer(VertexDataXml *dest)
{
    bool positions = (HasAttribute("positions") && ReadAttribute<bool>("positions"));
    bool normals   = (HasAttribute("normals") && ReadAttribute<bool>("normals"));
    bool tangents  = (HasAttribute("tangents") && ReadAttribute<bool>("tangents"));
    uint32_t uvs   = (HasAttribute("texture_coords") ? ReadAttribute<uint32_t>("texture_coords") : 0);

    // Not having positions is a error only if a previous vertex buffer did not have them.
    if (!positions && !dest->HasPositions()) {
        throw DeadlyImportError("Vertex buffer does not contain positions!");
    }

    if (positions)
    {
        ASSIMP_LOG_DEBUG("    - Contains positions");
        dest->positions.reserve(dest->count);
    }
    if (normals)
    {
        ASSIMP_LOG_DEBUG("    - Contains normals");
        dest->normals.reserve(dest->count);
    }
    if (tangents)
    {
        ASSIMP_LOG_DEBUG("    - Contains tangents");
        dest->tangents.reserve(dest->count);
    }
    if (uvs > 0)
    {
        ASSIMP_LOG_DEBUG_F( "    - Contains ", uvs, " texture coords");
        dest->uvs.resize(uvs);
        for(size_t i=0, len=dest->uvs.size(); i<len; ++i) {
            dest->uvs[i].reserve(dest->count);
        }
    }

    bool warnBinormal = true;
    bool warnColorDiffuse = true;
    bool warnColorSpecular = true;

    NextNode();

    while(m_currentNodeName == nnVertex       ||
          m_currentNodeName == nnPosition     ||
          m_currentNodeName == nnNormal       ||
          m_currentNodeName == nnTangent      ||
          m_currentNodeName == nnBinormal     ||
          m_currentNodeName == nnTexCoord     ||
          m_currentNodeName == nnColorDiffuse ||
          m_currentNodeName == nnColorSpecular)
    {
        if (m_currentNodeName == nnVertex) {
            NextNode();
        }

        /// @todo Implement nnBinormal, nnColorDiffuse and nnColorSpecular

        if (positions && m_currentNodeName == nnPosition)
        {
            aiVector3D pos;
            pos.x = ReadAttribute<float>(anX);
            pos.y = ReadAttribute<float>(anY);
            pos.z = ReadAttribute<float>(anZ);
            dest->positions.push_back(pos);
        }
        else if (normals && m_currentNodeName == nnNormal)
        {
            aiVector3D normal;
            normal.x = ReadAttribute<float>(anX);
            normal.y = ReadAttribute<float>(anY);
            normal.z = ReadAttribute<float>(anZ);
            dest->normals.push_back(normal);
        }
        else if (tangents && m_currentNodeName == nnTangent)
        {
            aiVector3D tangent;
            tangent.x = ReadAttribute<float>(anX);
            tangent.y = ReadAttribute<float>(anY);
            tangent.z = ReadAttribute<float>(anZ);
            dest->tangents.push_back(tangent);
        }
        else if (uvs > 0 && m_currentNodeName == nnTexCoord)
        {
            for(auto &uvs : dest->uvs)
            {
                if (m_currentNodeName != nnTexCoord) {
                    throw DeadlyImportError("Vertex buffer declared more UVs than can be found in a vertex");
                }

                aiVector3D uv;
                uv.x = ReadAttribute<float>("u");
                uv.y = (ReadAttribute<float>("v") * -1) + 1; // Flip UV from Ogre to Assimp form
                uvs.push_back(uv);

                NextNode();
            }
            // Continue main loop as above already read next node
            continue;
        }
        else
        {
            /// @todo Remove this stuff once implemented. We only want to log warnings once per element.
            bool warn = true;
            if (m_currentNodeName == nnBinormal)
            {
                if (warnBinormal)
                {
                    warnBinormal = false;
                }
                else
                {
                    warn = false;
                }
            }
            else if (m_currentNodeName == nnColorDiffuse)
            {
                if (warnColorDiffuse)
                {
                    warnColorDiffuse = false;
                }
                else
                {
                    warn = false;
                }
            }
            else if (m_currentNodeName == nnColorSpecular)
            {
                if (warnColorSpecular)
                {
                    warnColorSpecular = false;
                }
                else
                {
                    warn = false;
                }
            }
            if (warn) {
                ASSIMP_LOG_WARN_F("Vertex buffer attribute read not implemented for element: ", m_currentNodeName);
            }
        }

        // Advance
        NextNode();
    }

    // Sanity checks
    if (dest->positions.size() != dest->count) {
      throw DeadlyImportError(Formatter::format() << "Read only " << dest->positions.size() << " positions when should have read " << dest->count);
    }
    if (normals && dest->normals.size() != dest->count) {
        throw DeadlyImportError(Formatter::format() << "Read only " << dest->normals.size() << " normals when should have read " << dest->count);
    }
    if (tangents && dest->tangents.size() != dest->count) {
        throw DeadlyImportError(Formatter::format() << "Read only " << dest->tangents.size() << " tangents when should have read " << dest->count);
    }
    for(unsigned int i=0; i<dest->uvs.size(); ++i)
    {
        if (dest->uvs[i].size() != dest->count) {
            throw DeadlyImportError(Formatter::format() << "Read only " << dest->uvs[i].size()
                << " uvs for uv index " << i << " when should have read " << dest->count);
        }
    }
}